

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

SerializedMessage * __thiscall
miniros::serialization::serializeServiceResponse<std_msgs::String_<std::allocator<void>>>
          (SerializedMessage *__return_storage_ptr__,serialization *this,bool ok,
          String_<std::allocator<void>_> *message)

{
  uchar *puVar1;
  undefined7 in_register_00000011;
  int iVar2;
  ulong uVar3;
  OStream s;
  OStream local_28;
  
  (__return_storage_ptr__->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->type_info = (type_info *)0x0;
  __return_storage_ptr__->num_bytes = 0;
  __return_storage_ptr__->message_start = (uint8_t *)0x0;
  (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar2 = (int)*(undefined8 *)(CONCAT71(in_register_00000011,ok) + 8);
  if ((int)this == 0) {
    uVar3 = (ulong)(iVar2 + 5);
    __return_storage_ptr__->num_bytes = uVar3;
    puVar1 = (uchar *)operator_new__(uVar3);
    std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
              ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
               puVar1);
    local_28.super_Stream.data_ =
         (__return_storage_ptr__->buf).
         super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_28.super_Stream.end_ =
         local_28.super_Stream.data_ + (uint)__return_storage_ptr__->num_bytes;
    Serializer<unsigned_char>::write<miniros::serialization::OStream>(&local_28,(uint8_t)this);
    Serializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    write<miniros::serialization::OStream>
              (&local_28,(StringType *)CONCAT71(in_register_00000011,ok));
  }
  else {
    uVar3 = (ulong)(iVar2 + 9);
    __return_storage_ptr__->num_bytes = uVar3;
    puVar1 = (uchar *)operator_new__(uVar3);
    std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
              ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
               puVar1);
    local_28.super_Stream.data_ =
         (__return_storage_ptr__->buf).
         super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_28.super_Stream.end_ =
         local_28.super_Stream.data_ + (uint)__return_storage_ptr__->num_bytes;
    Serializer<unsigned_char>::write<miniros::serialization::OStream>(&local_28,(uint8_t)this);
    Serializer<unsigned_int>::write<miniros::serialization::OStream>
              (&local_28,(int)__return_storage_ptr__->num_bytes - 5);
    Serializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    write<miniros::serialization::OStream>
              (&local_28,(StringType *)CONCAT71(in_register_00000011,ok));
  }
  return __return_storage_ptr__;
}

Assistant:

inline SerializedMessage serializeServiceResponse(bool ok, const M& message)
{
  SerializedMessage m;

  if (ok)
  {
    uint32_t len = serializationLength(message);
    m.num_bytes = len + 5;
    m.buf.reset(new uint8_t[m.num_bytes]);

    OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
    serialize(s, static_cast<uint8_t>(ok));
    serialize(s, static_cast<uint32_t>(m.num_bytes) - 5);
    serialize(s, message);
  }
  else
  {
    uint32_t len = serializationLength(message);
    m.num_bytes = len + 1;
    m.buf.reset(new uint8_t[m.num_bytes]);

    OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
    serialize(s, static_cast<uint8_t>(ok));
    serialize(s, message);
  }

  return m;
}